

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_invert.c
# Opt level: O0

void crypto_sign_ed25519_ref10_fe_invert(int32_t *out,int32_t *z)

{
  int i;
  fe t3;
  fe t2;
  fe t1;
  fe t0;
  int32_t *in_stack_00000158;
  int32_t *in_stack_00000160;
  int32_t *in_stack_000002e8;
  int32_t *in_stack_000002f0;
  int32_t *in_stack_000002f8;
  undefined4 local_cc;
  
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 1; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 2; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 1; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 5; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 10; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 0x14; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 10; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 0x32; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 100; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 0x32; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  for (local_cc = 1; local_cc < 5; local_cc = local_cc + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000160,in_stack_00000158);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
  return;
}

Assistant:

void fe_invert(fe out,const fe z)
{
  fe t0;
  fe t1;
  fe t2;
  fe t3;
  int i;

#include "pow225521.h"

  return;
}